

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O1

FedObject * __thiscall MasterObjectHolder::findFed(MasterObjectHolder *this,string_view fedName)

{
  _Elt_pointer puVar1;
  FedObject *pFVar2;
  element_type *peVar3;
  bool bVar4;
  int iVar5;
  _Elt_pointer puVar6;
  unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *fed;
  _Elt_pointer puVar7;
  size_t __n;
  _Map_pointer ppuVar8;
  FedObject *unaff_R15;
  bool bVar9;
  handle handle;
  unique_lock<std::mutex> local_40;
  
  __n = fedName._M_len;
  local_40._M_device = &(this->feds).m_mutex;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  puVar7 = (this->feds).m_obj.
           super__Deque_base<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  puVar1 = (this->feds).m_obj.
           super__Deque_base<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (puVar7 == puVar1) {
    unaff_R15 = (FedObject *)0x0;
  }
  else {
    puVar6 = (this->feds).m_obj.
             super__Deque_base<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppuVar8 = (this->feds).m_obj.
              super__Deque_base<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      pFVar2 = (puVar7->_M_t).
               super___uniq_ptr_impl<helics::FedObject,_std::default_delete<helics::FedObject>_>.
               _M_t.
               super__Tuple_impl<0UL,_helics::FedObject_*,_std::default_delete<helics::FedObject>_>.
               super__Head_base<0UL,_helics::FedObject_*,_false>._M_head_impl;
      bVar4 = true;
      if ((pFVar2 != (FedObject *)0x0) &&
         (peVar3 = (pFVar2->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr, peVar3 != (element_type *)0x0)) {
        bVar9 = *(size_type *)((long)&peVar3->mName + 8) == __n;
        if (bVar9 && __n != 0) {
          iVar5 = bcmp(fedName._M_str,(peVar3->mName)._M_dataplus._M_p,__n);
          bVar9 = iVar5 == 0;
        }
        bVar4 = (bool)(bVar9 ^ 1);
        if (bVar9) {
          unaff_R15 = pFVar2;
        }
      }
      if (!bVar4) goto LAB_0019c399;
      puVar7 = puVar7 + 1;
      if (puVar7 == puVar6) {
        puVar7 = ppuVar8[1];
        ppuVar8 = ppuVar8 + 1;
        puVar6 = puVar7 + 0x40;
      }
    } while (puVar7 != puVar1);
    unaff_R15 = (FedObject *)0x0;
  }
LAB_0019c399:
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return unaff_R15;
}

Assistant:

helics::FedObject* MasterObjectHolder::findFed(std::string_view fedName)
{
    auto handle = feds.lock();
    for (auto& fed : (*handle)) {
        if ((fed) && (fed->fedptr)) {
            if (fed->fedptr->getName() == fedName) {
                return fed.get();
            }
        }
    }
    return nullptr;
}